

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frozen_benchmark.c
# Opt level: O0

void save(char *buf,size_t len)

{
  int __fd;
  ssize_t sVar1;
  size_t in_RSI;
  void *in_RDI;
  ssize_t res;
  int fd;
  char *in_stack_ffffffffffffffe0;
  size_t local_10;
  void *local_8;
  
  __fd = open("/tmp/roaring.bin",0x241,0x1b6);
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (__fd == -1) {
    die(in_stack_ffffffffffffffe0);
  }
  for (; local_10 != 0; local_10 = local_10 - sVar1) {
    sVar1 = write(__fd,local_8,local_10);
    if (sVar1 == -1) {
      die((char *)0xffffffffffffffff);
    }
    local_8 = (void *)(sVar1 + (long)local_8);
  }
  close(__fd);
  return;
}

Assistant:

void save(const char *buf, size_t len) {
    int fd = open(FILENAME, O_WRONLY | O_CREAT | O_TRUNC, 0666);
    if (fd == -1) {
        die("open");
    }
    while (len > 0) {
        ssize_t res = write(fd, buf, len);
        if (res == -1) {
            die("write");
        }
        buf += res;
        len -= res;
    }
    close(fd);
}